

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropout_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Dropout_x86::forward_inplace(Dropout_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  float *pfVar11;
  uint uVar12;
  int iVar13;
  bool bVar14;
  
  fVar2 = *(float *)(&this->field_0xd0 + (long)this->_vptr_Dropout_x86[-3]);
  if (fVar2 != 1.0) {
    if (bottom_top_blob->elempack != 4) {
      iVar6 = Dropout::forward_inplace
                        ((Dropout *)
                         ((long)&this->_vptr_Dropout_x86 + (long)this->_vptr_Dropout_x86[-3]),
                         bottom_top_blob,opt);
      return iVar6;
    }
    iVar6 = bottom_top_blob->dims;
    uVar9 = bottom_top_blob->w;
    uVar12 = bottom_top_blob->h;
    if (iVar6 == 3) {
      uVar10 = 0;
      iVar6 = uVar12 * uVar9;
      if ((int)(uVar12 * uVar9) < 1) {
        iVar6 = 0;
      }
      uVar8 = (ulong)(uint)bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        uVar8 = 0;
      }
      for (; uVar10 != uVar8; uVar10 = uVar10 + 1) {
        pfVar11 = (float *)(bottom_top_blob->cstep * uVar10 * bottom_top_blob->elemsize +
                           (long)bottom_top_blob->data);
        iVar13 = iVar6;
        while (bVar14 = iVar13 != 0, iVar13 = iVar13 + -1, bVar14) {
          *pfVar11 = *pfVar11 * fVar2;
          pfVar11[1] = pfVar11[1] * fVar2;
          pfVar11[2] = pfVar11[2] * fVar2;
          pfVar11[3] = pfVar11[3] * fVar2;
          pfVar11 = pfVar11 + 4;
        }
      }
    }
    else if (iVar6 == 2) {
      uVar10 = 0;
      if ((int)uVar9 < 1) {
        uVar9 = 0;
      }
      uVar8 = (ulong)uVar12;
      if ((int)uVar12 < 1) {
        uVar8 = 0;
      }
      for (; uVar10 != uVar8; uVar10 = uVar10 + 1) {
        pfVar11 = (float *)((long)bottom_top_blob->w * uVar10 * bottom_top_blob->elemsize +
                           (long)bottom_top_blob->data);
        uVar12 = uVar9;
        while (bVar14 = uVar12 != 0, uVar12 = uVar12 - 1, bVar14) {
          *pfVar11 = *pfVar11 * fVar2;
          pfVar11[1] = pfVar11[1] * fVar2;
          pfVar11[2] = pfVar11[2] * fVar2;
          pfVar11[3] = pfVar11[3] * fVar2;
          pfVar11 = pfVar11 + 4;
        }
      }
    }
    else if (iVar6 == 1) {
      lVar7 = 0;
      if ((int)uVar9 < 1) {
        uVar9 = 0;
      }
      for (; (ulong)uVar9 * 0x10 != lVar7; lVar7 = lVar7 + 0x10) {
        pfVar11 = (float *)((long)bottom_top_blob->data + lVar7);
        fVar3 = pfVar11[1];
        fVar4 = pfVar11[2];
        fVar5 = pfVar11[3];
        pfVar1 = (float *)((long)bottom_top_blob->data + lVar7);
        *pfVar1 = *pfVar11 * fVar2;
        pfVar1[1] = fVar3 * fVar2;
        pfVar1[2] = fVar4 * fVar2;
        pfVar1[3] = fVar5 * fVar2;
      }
    }
  }
  return 0;
}

Assistant:

int Dropout_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (scale == 1.f)
    {
        return 0;
    }

#if __SSE2__
    int dims = bottom_top_blob.dims;
    int elempack = bottom_top_blob.elempack;

#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        Mat tmp;
        convert_packing(bottom_top_blob, tmp, 8, opt);

        forward_inplace(tmp, opt);

        convert_packing(tmp, bottom_top_blob, 16, opt);

        return 0;
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m256 _scale = _mm256_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 8;
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_mul_ps(_p, _scale);
                _mm256_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m128 _scale = _mm_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 4;
                __m128 _p = _mm_loadu_ps(ptr);
                _p = _mm_mul_ps(_p, _scale);
                _mm_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    return Dropout::forward_inplace(bottom_top_blob, opt);
}